

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetScrollFromPosX(ImGuiWindow_conflict *window,float param_2,float center_x_ratio)

{
  if ((0.0 <= center_x_ratio) && (center_x_ratio <= 1.0)) {
    (window->ScrollTarget).x = (float)(int)(param_2 + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = center_x_ratio;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
    return;
  }
  __assert_fail("center_x_ratio >= 0.0f && center_x_ratio <= 1.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                ,0x2242,"void ImGui::SetScrollFromPosX(ImGuiWindow *, float, float)");
}

Assistant:

void ImGui::SetScrollFromPosX(ImGuiWindow* window, float local_x, float center_x_ratio)
{
    IM_ASSERT(center_x_ratio >= 0.0f && center_x_ratio <= 1.0f);
    window->ScrollTarget.x = IM_FLOOR(local_x + window->Scroll.x); // Convert local position to scroll offset
    window->ScrollTargetCenterRatio.x = center_x_ratio;
    window->ScrollTargetEdgeSnapDist.x = 0.0f;
}